

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O2

void __thiscall
UnitTests::Assert::Equals<char[24],std::__cxx11::string>
          (Assert *this,char (*expected) [24],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  Equals<char[24],std::__cxx11::string>(this,&local_28,expected,actual);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void Equals(const T& expected, const U& actual) const
        {
            Equals(std::string(), expected, actual);
        }